

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

int uv_timer_init(uv_loop_t *loop,uv_timer_t *handle)

{
  uv_timer_t *handle_local;
  uv_loop_t *loop_local;
  
  handle->loop = loop;
  handle->type = UV_TIMER;
  handle->flags = 8;
  uv__queue_insert_tail(&loop->handle_queue,&handle->handle_queue);
  handle->next_closing = (uv_handle_t *)0x0;
  handle->timer_cb = (uv_timer_cb)0x0;
  handle->timeout = 0;
  handle->repeat = 0;
  uv__queue_init(&(handle->node).queue);
  return 0;
}

Assistant:

int uv_timer_init(uv_loop_t* loop, uv_timer_t* handle) {
  uv__handle_init(loop, (uv_handle_t*)handle, UV_TIMER);
  handle->timer_cb = NULL;
  handle->timeout = 0;
  handle->repeat = 0;
  uv__queue_init(&handle->node.queue);
  return 0;
}